

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rstarplanner.cpp
# Opt level: O0

CMDPSTATE * __thiscall RSTARPlanner::GetState(RSTARPlanner *this,int stateID)

{
  _Ios_Openmode _Var1;
  size_type sVar2;
  ostream *poVar3;
  undefined8 uVar4;
  reference ppiVar5;
  reference ppCVar6;
  vector<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_> *this_00;
  int in_ESI;
  long in_RDI;
  stringstream ss;
  string *in_stack_fffffffffffffdc8;
  SBPL_Exception *in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffe04;
  char *in_stack_fffffffffffffe08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  allocator<char> local_1c1;
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190 [380];
  int local_14;
  CMDPSTATE *local_8;
  
  local_14 = in_ESI;
  sVar2 = std::vector<int_*,_std::allocator<int_*>_>::size
                    ((vector<int_*,_std::allocator<int_*>_> *)(*(long *)(in_RDI + 8) + 8));
  if ((int)sVar2 <= in_ESI) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffe04,in_ESI));
    _Var1 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream(local_1a0,local_1c0,_Var1);
    std::__cxx11::string::~string(local_1c0);
    std::allocator<char>::~allocator(&local_1c1);
    poVar3 = (ostream *)std::ostream::operator<<(local_190,local_14);
    std::operator<<(poVar3," is invalid");
    uVar4 = __cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    SBPL_Exception::SBPL_Exception(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    __cxa_throw(uVar4,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  ppiVar5 = std::vector<int_*,_std::allocator<int_*>_>::operator[]
                      ((vector<int_*,_std::allocator<int_*>_> *)(*(long *)(in_RDI + 8) + 8),
                       (long)local_14);
  if (**ppiVar5 == -1) {
    local_8 = CreateState((RSTARPlanner *)CONCAT44(in_stack_fffffffffffffe04,in_ESI),
                          (int)((ulong)in_RDI >> 0x20));
  }
  else {
    this_00 = (vector<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_> *)(*(long *)(in_RDI + 0x38) + 0x30)
    ;
    ppiVar5 = std::vector<int_*,_std::allocator<int_*>_>::operator[]
                        ((vector<int_*,_std::allocator<int_*>_> *)(*(long *)(in_RDI + 8) + 8),
                         (long)local_14);
    ppCVar6 = std::vector<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>::operator[]
                        (this_00,(long)**ppiVar5);
    local_8 = *ppCVar6;
  }
  return local_8;
}

Assistant:

CMDPSTATE* RSTARPlanner::GetState(int stateID)
{
    if (stateID >= (int)environment_->StateID2IndexMapping.size()) {
        SBPL_ERROR("ERROR int GetState: stateID %d is invalid\n", stateID);
        std::stringstream ss("ERROR int GetState: stateID ");
        ss << stateID << " is invalid";
        throw SBPL_Exception(ss.str());
    }

    if (environment_->StateID2IndexMapping[stateID][RSTARMDP_STATEID2IND] == -1)
        return CreateState(stateID);
    else
        return pSearchStateSpace->searchMDP.StateArray[environment_->StateID2IndexMapping[stateID][RSTARMDP_STATEID2IND]];
}